

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

void Bac_PtrDumpModuleBlif(FILE *pFile,Vec_Ptr_t *vNtk)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *vNtk_local;
  FILE *pFile_local;
  
  pvVar2 = Vec_PtrEntry(vNtk,0);
  fprintf((FILE *)pFile,".model %s\n",pvVar2);
  fprintf((FILE *)pFile,".inputs");
  pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,1);
  Bac_PtrDumpSignalsBlif(pFile,pVVar3,0);
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,".outputs");
  pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,2);
  Bac_PtrDumpSignalsBlif(pFile,pVVar3,1);
  fprintf((FILE *)pFile,"\n");
  pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,3);
  iVar1 = Vec_PtrSize(pVVar3);
  if (iVar1 == 0) {
    pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vNtk,4);
    Bac_PtrDumpBoxesBlif(pFile,pVVar3);
    fprintf((FILE *)pFile,".end\n\n");
    return;
  }
  __assert_fail("Vec_PtrSize((Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtr.c"
                ,0xbc,"void Bac_PtrDumpModuleBlif(FILE *, Vec_Ptr_t *)");
}

Assistant:

void Bac_PtrDumpModuleBlif( FILE * pFile, Vec_Ptr_t * vNtk )
{
    fprintf( pFile, ".model %s\n", (char *)Vec_PtrEntry(vNtk, 0) );
    fprintf( pFile, ".inputs" );
    Bac_PtrDumpSignalsBlif( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1), 0 );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    Bac_PtrDumpSignalsBlif( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2), 1 );
    fprintf( pFile, "\n" );
    assert( Vec_PtrSize((Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3)) == 0 ); // no nodes; only boxes
    Bac_PtrDumpBoxesBlif( pFile, (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4) );
    fprintf( pFile, ".end\n\n" );
}